

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

void __thiscall
Clasp::DefaultMinimize::reason(DefaultMinimize *this,Solver *s,Literal p,LitVec *lits)

{
  bool bVar1;
  Var VVar2;
  uint32 uVar3;
  SharedContext *this_00;
  char *pcVar4;
  Solver *in_RSI;
  size_type *__s;
  Solver *in_RDI;
  UndoInfo u;
  uint32 i;
  Literal x;
  uint32 stop;
  Solver *in_stack_ffffffffffffffa8;
  Var v;
  pointer puVar5;
  undefined8 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  Literal in_stack_ffffffffffffffc4;
  undefined4 uVar6;
  uint local_38;
  uint32 local_2c [2];
  uint32 local_24;
  Solver *local_18;
  
  local_18 = in_RSI;
  local_24 = Solver::reasonData(in_stack_ffffffffffffffa8,
                                (Literal)(uint32)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  v = (Var)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  this_00 = Solver::sharedContext(local_18);
  local_2c[0] = (uint32)SharedContext::stepLiteral(this_00);
  bVar1 = isSentinel((Literal)0x0);
  if ((!bVar1) && (bVar1 = Solver::isTrue(in_RDI,in_stack_ffffffffffffffc4), bVar1)) {
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
               CONCAT44(in_stack_ffffffffffffffc4.rep_,in_stack_ffffffffffffffc0),(Literal *)in_RDI)
    ;
  }
  VVar2 = Literal::var((Literal *)&(in_RDI->model).ebo_.size);
  __s = (size_type *)(ulong)VVar2;
  uVar3 = Solver::level(local_18,v);
  if (uVar3 != 0) {
    __s = &(in_RDI->model).ebo_.size;
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
               CONCAT44(in_stack_ffffffffffffffc4.rep_,in_stack_ffffffffffffffc0),(Literal *)in_RDI)
    ;
  }
  for (local_38 = 0; local_38 != local_24; local_38 = local_38 + 1) {
    uVar6 = *(undefined4 *)((in_RDI->stats).super_CoreStats.choices + (ulong)local_38 * 4);
    puVar5 = (in_RDI->model).ebo_.buf;
    pcVar4 = UndoInfo::index((UndoInfo *)&stack0xffffffffffffffc4,(char *)__s,local_38);
    local_2c[0] = *(uint32 *)(puVar5 + ((ulong)pcVar4 & 0xffffffff) * 8 + 0x68);
    __s = local_2c;
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
               CONCAT44(uVar6,in_stack_ffffffffffffffc0),(Literal *)in_RDI);
  }
  return;
}

Assistant:

void DefaultMinimize::reason(Solver& s, Literal p, LitVec& lits) {
	assert(s.isTrue(tag_));
	uint32 stop = s.reasonData(p);
	Literal   x = s.sharedContext()->stepLiteral();
	assert(stop <= undoTop_);
	if (!isSentinel(x) && s.isTrue(x)) { lits.push_back(x); }
	if (s.level(tag_.var()))           { lits.push_back(tag_); }
	for (uint32 i = 0; i != stop; ++i) {
		UndoInfo u = undo_[i];
		x = shared_->lits[u.index()].first;
		lits.push_back(x);
	}
}